

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t cab_next_cfdata(archive_read *a)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  int64_t iVar4;
  uint *__src;
  void *__ptr;
  long lVar5;
  char *fmt;
  int error_number;
  long request;
  uint *puVar6;
  ulong uVar7;
  uchar *p;
  
  pvVar3 = a->format->data;
  lVar5 = *(long *)((long)pvVar3 + 0x38);
  if (lVar5 == 0) {
    puVar6 = *(uint **)((long)pvVar3 + 0x28);
    puVar6[0x16] = 0;
    request = (ulong)*puVar6 - *(long *)((long)pvVar3 + 0x40);
    if (request < 0) {
      uVar2 = *(ushort *)(*(long *)((long)pvVar3 + 0x30) + 0x10);
      uVar7 = 0;
      if ((uVar2 != 0xfffd) && (uVar2 != 0xffff)) {
        if (uVar2 == 0xfffe) {
          uVar7 = (ulong)(*(ushort *)((long)pvVar3 + 0x50) - 1);
        }
        else {
          uVar7 = (ulong)(uint)uVar2;
        }
      }
      archive_set_error(&a->archive,-1,"Invalid offset of CFDATA in folder(%d) %jd < %jd",uVar7);
      return L'\xffffffe2';
    }
    if (request != 0) {
      iVar4 = __archive_read_consume(a,request);
      if (iVar4 < 0) {
        return L'\xffffffe2';
      }
      puVar6 = *(uint **)((long)pvVar3 + 0x28);
      *(ulong *)((long)pvVar3 + 0x40) = (ulong)*puVar6;
    }
  }
  else {
    if (*(short *)(lVar5 + 10) != 0) {
      return L'\0';
    }
    puVar6 = *(uint **)((long)pvVar3 + 0x28);
  }
  if ((int)(uint)(ushort)puVar6[1] <= (int)puVar6[0x16]) {
    if ((ushort)puVar6[1] != 0) {
      *(undefined8 *)(lVar5 + 4) = 0;
      return L'\0';
    }
    *(uint **)((long)pvVar3 + 0x38) = puVar6 + 6;
    puVar6[0x12] = 0;
    puVar6[0x13] = 0;
    puVar6[0x14] = 0;
    puVar6[0x15] = 0;
    puVar6[0xe] = 0;
    puVar6[0xf] = 0;
    puVar6[0x10] = 0;
    puVar6[0x11] = 0;
    puVar6[10] = 0;
    puVar6[0xb] = 0;
    puVar6[0xc] = 0;
    puVar6[0xd] = 0;
    puVar6[6] = 0;
    puVar6[7] = 0;
    puVar6[8] = 0;
    puVar6[9] = 0;
    return L'\0';
  }
  puVar6[0x16] = puVar6[0x16] + 1;
  *(uint **)((long)pvVar3 + 0x38) = puVar6 + 6;
  puVar6[0x10] = 0;
  puVar6[0x12] = 0;
  puVar6[0x14] = 0;
  puVar6[0x15] = 0;
  uVar7 = 8;
  if ((*(byte *)((long)pvVar3 + 0x54) & 4) != 0) {
    uVar7 = (ulong)*(byte *)((long)pvVar3 + 0x5d) + 8;
  }
  __src = (uint *)__archive_read_ahead(a,uVar7,(ssize_t *)0x0);
  if (__src == (uint *)0x0) {
    fmt = "Truncated CAB header";
  }
  else {
    puVar6[6] = *__src;
    uVar2 = (ushort)__src[1];
    *(ushort *)(puVar6 + 7) = uVar2;
    *(ushort *)((long)puVar6 + 0x1e) = uVar2;
    uVar1 = *(ushort *)((long)__src + 6);
    *(ushort *)(puVar6 + 8) = uVar1;
    *(ushort *)((long)puVar6 + 0x22) = uVar1;
    puVar6[9] = 0;
    puVar6[10] = 0;
    puVar6[0xb] = 0;
    if ((0x67ff < (ushort)(uVar2 + 0x67ff)) && (uVar1 < 0x8001)) {
      if (uVar1 == 0) {
        if ((0xfffd < *(ushort *)(*(long *)((long)pvVar3 + 0x30) + 0x10)) &&
           (lVar5 = *(long *)((long)pvVar3 + 0x28),
           (int)(uint)*(ushort *)(lVar5 + 4) <= *(int *)(lVar5 + 0x58))) goto LAB_004edcf8;
      }
      else {
        lVar5 = *(long *)((long)pvVar3 + 0x28);
        if ((int)(uint)*(ushort *)(lVar5 + 4) <= *(int *)(lVar5 + 0x58)) {
LAB_004edcf8:
          if ((*(short *)(lVar5 + 6) != 0) || (uVar2 == uVar1)) {
            __ptr = *(void **)(puVar6 + 0xe);
            if (uVar7 <= *(ulong *)(puVar6 + 0xc)) {
LAB_004edd50:
              memcpy(__ptr,__src,uVar7);
              __archive_read_consume(a,uVar7);
              *(long *)((long)pvVar3 + 0x40) = *(long *)((long)pvVar3 + 0x40) + uVar7;
              return L'\0';
            }
            free(__ptr);
            __ptr = malloc(uVar7);
            *(void **)(puVar6 + 0xe) = __ptr;
            if (__ptr != (void *)0x0) {
              *(ulong *)(puVar6 + 0xc) = uVar7;
              goto LAB_004edd50;
            }
            fmt = "Can\'t allocate memory for CAB data";
            error_number = 0xc;
            goto LAB_004edd13;
          }
        }
      }
    }
    fmt = "Invalid CFDATA";
  }
  error_number = 0x54;
LAB_004edd13:
  archive_set_error(&a->archive,error_number,fmt);
  return L'\xffffffe2';
}

Assistant:

static int
cab_next_cfdata(struct archive_read *a)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata = cab->entry_cfdata;

	/* There are remaining bytes in current CFDATA, use it first. */
	if (cfdata != NULL && cfdata->uncompressed_bytes_remaining > 0)
		return (ARCHIVE_OK);

	if (cfdata == NULL) {
		int64_t skip;

		cab->entry_cffolder->cfdata_index = 0;

		/* Seek read pointer to the offset of CFDATA if needed. */
		skip = cab->entry_cffolder->cfdata_offset_in_cab
			- cab->cab_offset;
		if (skip < 0) {
			int folder_index;
			switch (cab->entry_cffile->folder) {
			case iFoldCONTINUED_FROM_PREV:
			case iFoldCONTINUED_PREV_AND_NEXT:
				folder_index = 0;
				break;
			case iFoldCONTINUED_TO_NEXT:
				folder_index = cab->cfheader.folder_count-1;
				break;
			default:
				folder_index = cab->entry_cffile->folder;
				break;
			}
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid offset of CFDATA in folder(%d) %jd < %jd",
			    folder_index,
			    (intmax_t)cab->entry_cffolder->cfdata_offset_in_cab,
			    (intmax_t)cab->cab_offset);
			return (ARCHIVE_FATAL);
		}
		if (skip > 0) {
			if (__archive_read_consume(a, skip) < 0)
				return (ARCHIVE_FATAL);
			cab->cab_offset =
			    cab->entry_cffolder->cfdata_offset_in_cab;
		}
	}

	/*
	 * Read a CFDATA.
	 */
	if (cab->entry_cffolder->cfdata_index <
	    cab->entry_cffolder->cfdata_count) {
		const unsigned char *p;
		int l;

		cfdata = &(cab->entry_cffolder->cfdata);
		cab->entry_cffolder->cfdata_index++;
		cab->entry_cfdata = cfdata;
		cfdata->sum_calculated = 0;
		cfdata->sum_extra_avail = 0;
		cfdata->sum_ptr = NULL;
		l = 8;
		if (cab->cfheader.flags & RESERVE_PRESENT)
			l += cab->cfheader.cfdata;
		if ((p = __archive_read_ahead(a, l, NULL)) == NULL)
			return (truncated_error(a));
		cfdata->sum = archive_le32dec(p + CFDATA_csum);
		cfdata->compressed_size = archive_le16dec(p + CFDATA_cbData);
		cfdata->compressed_bytes_remaining = cfdata->compressed_size;
		cfdata->uncompressed_size =
		    archive_le16dec(p + CFDATA_cbUncomp);
		cfdata->uncompressed_bytes_remaining =
		    cfdata->uncompressed_size;
		cfdata->uncompressed_avail = 0;
		cfdata->read_offset = 0;
		cfdata->unconsumed = 0;

		/*
		 * Sanity check if data size is acceptable.
		 */
		if (cfdata->compressed_size == 0 ||
		    cfdata->compressed_size > (0x8000+6144))
			goto invalid;
		if (cfdata->uncompressed_size > 0x8000)
			goto invalid;
		if (cfdata->uncompressed_size == 0) {
			switch (cab->entry_cffile->folder) {
			case iFoldCONTINUED_PREV_AND_NEXT:
			case iFoldCONTINUED_TO_NEXT:
				break;
			case iFoldCONTINUED_FROM_PREV:
			default:
				goto invalid;
			}
		}
		/* If CFDATA is not last in a folder, an uncompressed
		 * size must be 0x8000(32KBi) */
		if ((cab->entry_cffolder->cfdata_index <
		     cab->entry_cffolder->cfdata_count) &&
		       cfdata->uncompressed_size != 0x8000)
			goto invalid;

		/* A compressed data size and an uncompressed data size must
		 * be the same in no compression mode. */
		if (cab->entry_cffolder->comptype == COMPTYPE_NONE &&
		    cfdata->compressed_size != cfdata->uncompressed_size)
			goto invalid;

		/*
		 * Save CFDATA image for sum check.
		 */
		if (cfdata->memimage_size < (size_t)l) {
			free(cfdata->memimage);
			cfdata->memimage = malloc(l);
			if (cfdata->memimage == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for CAB data");
				return (ARCHIVE_FATAL);
			}
			cfdata->memimage_size = l;
		}
		memcpy(cfdata->memimage, p, l);

		/* Consume bytes as much as we used. */
		__archive_read_consume(a, l);
		cab->cab_offset += l;
	} else if (cab->entry_cffolder->cfdata_count > 0) {
		/* Run out of all CFDATA in a folder. */
		cfdata->compressed_size = 0;
		cfdata->uncompressed_size = 0;
		cfdata->compressed_bytes_remaining = 0;
		cfdata->uncompressed_bytes_remaining = 0;
	} else {
		/* Current folder does not have any CFDATA. */
		cfdata = &(cab->entry_cffolder->cfdata);
		cab->entry_cfdata = cfdata;
		memset(cfdata, 0, sizeof(*cfdata));
	}
	return (ARCHIVE_OK);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid CFDATA");
	return (ARCHIVE_FATAL);
}